

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O3

sexp_conflict
sexp_make_tm_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                 sexp_conflict arg1,sexp_conflict arg2,sexp_conflict arg3,sexp_conflict arg4,
                 sexp_conflict arg5,sexp_conflict arg6)

{
  sexp_conflict psVar1;
  sexp psVar2;
  int iVar3;
  sexp_tag_t sVar4;
  sexp_conflict res;
  sexp_conflict local_48;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_48;
  local_48 = (sexp_conflict)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,(long)(self->value).type.setters >> 1);
  local_48 = psVar1;
  psVar2 = (sexp)calloc(1,0x38);
  (psVar1->value).type.slots = psVar2;
  psVar1->field_0x5 = psVar1->field_0x5 | 2;
  if (((ulong)arg0 & 1) == 0) {
    if ((((ulong)arg0 & 2) == 0) && (arg0->tag == 0xc)) {
      sVar4 = (int)(arg0->value).flonum_bits[0] * (int)(arg0->value).uvector.length;
    }
    else {
      sVar4 = 0;
    }
  }
  else {
    sVar4 = (sexp_tag_t)((long)arg0 >> 1);
  }
  psVar2->tag = sVar4;
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      iVar3 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg1 >> 1);
  }
  *(int *)&psVar2->markedp = iVar3;
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      iVar3 = (int)(arg2->value).flonum_bits[0] * (int)(arg2->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg2 >> 1);
  }
  *(int *)&psVar2->value = iVar3;
  if (((ulong)arg3 & 1) == 0) {
    if ((((ulong)arg3 & 2) == 0) && (arg3->tag == 0xc)) {
      iVar3 = (int)(arg3->value).flonum_bits[0] * (int)(arg3->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg3 >> 1);
  }
  *(int *)((long)&psVar2->value + 4) = iVar3;
  if (((ulong)arg4 & 1) == 0) {
    if ((((ulong)arg4 & 2) == 0) && (arg4->tag == 0xc)) {
      iVar3 = (int)(arg4->value).flonum_bits[0] * (int)(arg4->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg4 >> 1);
  }
  (psVar2->value).promise.donep = iVar3;
  if (((ulong)arg5 & 1) == 0) {
    if ((((ulong)arg5 & 2) == 0) && (arg5->tag == 0xc)) {
      iVar3 = (int)(arg5->value).flonum_bits[0] * (int)(arg5->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg5 >> 1);
  }
  *(int *)((long)&psVar2->value + 0xc) = iVar3;
  if (((ulong)arg6 & 1) == 0) {
    if ((((ulong)arg6 & 2) == 0) && (arg6->tag == 0xc)) {
      iVar3 = (int)(arg6->value).flonum_bits[0] * (int)(arg6->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg6 >> 1);
  }
  *(int *)((long)&psVar2->value + 0x18) = iVar3;
  (ctx->value).context.saves = local_40.next;
  return local_48;
}

Assistant:

sexp sexp_make_tm_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3, sexp arg4, sexp arg5, sexp arg6) {
  struct tm* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct tm));
  r = (struct tm*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct tm));
  sexp_freep(res) = 1;
  r->tm_sec = sexp_sint_value(arg0);
  r->tm_min = sexp_sint_value(arg1);
  r->tm_hour = sexp_sint_value(arg2);
  r->tm_mday = sexp_sint_value(arg3);
  r->tm_mon = sexp_sint_value(arg4);
  r->tm_year = sexp_sint_value(arg5);
  r->tm_isdst = sexp_sint_value(arg6);
  sexp_gc_release1(ctx);
  return res;
}